

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O2

iuIParamGenerator<std::tuple<bool,_int,_int>_> * __thiscall
iutest::detail::iuCartesianProductHolder::operator_cast_to_iuIParamGenerator_
          (iuCartesianProductHolder *this)

{
  iuIParamGenerator<std::tuple<bool,_int,_int>_> *piVar1;
  
  piVar1 = (iuIParamGenerator<std::tuple<bool,_int,_int>_> *)operator_new(0x38);
  piVar1->_vptr_iuIParamGenerator = (_func_int **)&PTR__iuCartesianProductGenerator_0038d440;
  piVar1[1]._vptr_iuIParamGenerator = (_func_int **)&PTR__iuIParamGenerator_0038d2c0;
  piVar1[2]._vptr_iuIParamGenerator = (_func_int **)0x0;
  piVar1[3]._vptr_iuIParamGenerator = (_func_int **)&PTR__iuIParamGenerator_0038d2c0;
  piVar1[4]._vptr_iuIParamGenerator = (_func_int **)0x0;
  piVar1[5]._vptr_iuIParamGenerator = (_func_int **)&PTR__iuIParamGenerator_0038d328;
  piVar1[6]._vptr_iuIParamGenerator = (_func_int **)0x0;
  tuples::detail::
  tuple_cast_copy_impl<std::tuple<iutest::detail::iuParamGenerator<bool>,_iutest::detail::iuParamGenerator<int>,_iutest::detail::iuParamGenerator<int>_>,_std::tuple<const_iutest::detail::iuParamGenerator<bool>,_const_iutest::detail::iuValueArray<int,_int>,_const_iutest::detail::iuParamGenerator<int>_>_>
  ::impl<3,_0>::copy((EVP_PKEY_CTX *)(piVar1 + 1),(EVP_PKEY_CTX *)this);
  return piVar1;
}

Assistant:

operator iuIParamGenerator< tuples::tuple<Args...> >* () const
    {
        iuCartesianProductGenerator<Args...>* p = new iuCartesianProductGenerator<Args...>();
        tuples::tuple_cast_copy(p->generators(), v);
        return p;
    }